

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

long * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRaw<long>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 offset;
  OneofDescriptor *pOVar2;
  long *plVar3;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pOVar2 = FieldDescriptor::containing_oneof(field);
  if ((pOVar2 != (OneofDescriptor *)0x0) && (bVar1 = HasOneofField(this,message,field), !bVar1)) {
    plVar3 = DefaultRaw<long>(this,field);
    return plVar3;
  }
  offset = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  plVar3 = anon_unknown_0::GetConstRefAtOffset<long>(message,offset);
  return plVar3;
}

Assistant:

const Type& GeneratedMessageReflection::GetRaw(
    const Message& message, const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}